

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Value *this)

{
  pointer pcVar1;
  
  if ((this->mError).mCode == kNone) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->mData)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->mData)._M_string_length);
  }
  else {
    Error::ToString_abi_cxx11_(__return_storage_ptr__,&this->mError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::Value::ToString() const
{
    return HasNoError() ? mData : mError.ToString();
}